

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

int __thiscall GF2::VFunc<7UL,_8UL>::Deg(VFunc<7UL,_8UL> *this)

{
  long lVar1;
  int iVar2;
  size_t pos;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar9;
  undefined1 auVar8 [16];
  BFunc<7UL> bf;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_a8._16_16_ = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  iVar2 = -1;
  lVar3 = 0;
  do {
    lVar1 = 1L << ((byte)lVar3 & 0x3f);
    auVar4._8_4_ = (int)lVar1;
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = (int)((ulong)lVar1 >> 0x20);
    lVar1 = 0;
    do {
      auVar5 = *(undefined1 (*) [16])((this->super_Func<7UL,_GF2::WW<8UL>_>)._vals + lVar1) & auVar4
               ^ _DAT_0013d0f0;
      iVar7 = -(uint)((int)DAT_0013d0f0 < auVar5._0_4_);
      auVar8._4_4_ = -(uint)(DAT_0013d0f0._4_4_ < auVar5._4_4_);
      iVar9 = -(uint)(DAT_0013d0f0._8_4_ < auVar5._8_4_);
      auVar8._12_4_ = -(uint)(DAT_0013d0f0._12_4_ < auVar5._12_4_);
      auVar6._4_4_ = -(uint)(auVar5._4_4_ == DAT_0013d0f0._4_4_);
      auVar6._12_4_ = -(uint)(auVar5._12_4_ == DAT_0013d0f0._12_4_);
      auVar6._0_4_ = auVar6._4_4_;
      auVar6._8_4_ = auVar6._12_4_;
      auVar5._4_4_ = iVar7;
      auVar5._0_4_ = iVar7;
      auVar5._8_4_ = iVar9;
      auVar5._12_4_ = iVar9;
      auVar8._0_4_ = auVar8._4_4_;
      auVar8._8_4_ = auVar8._12_4_;
      auVar8 = auVar8 | auVar6 & auVar5;
      auVar5 = packssdw(auVar8,auVar8);
      auVar5 = packssdw(auVar5,auVar5);
      auVar5 = packsswb(auVar5,auVar5);
      *(ushort *)(local_a8 + lVar1) = auVar5._0_2_ & 0x101;
      lVar1 = lVar1 + 2;
    } while (lVar1 != 0x80);
    iVar7 = BFunc<7UL>::Deg((BFunc<7UL> *)local_a8);
    if (iVar2 < iVar7) {
      iVar2 = iVar7;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return iVar2;
}

Assistant:

int Deg() const
	{	
		BFunc<_n> bf;
		int record = -1, deg;
		for (size_t pos = 0; pos < _m; pos++)
		{
			GetCoord(pos, bf);
			if ((deg = bf.Deg()) > record)
				record = deg;
		}
		return record;
	}